

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O3

parse_buffer * buffer_skip_whitespace(parse_buffer *buffer)

{
  ulong uVar1;
  ulong uVar2;
  
  if (buffer != (parse_buffer *)0x0) {
    if (buffer->content != (uchar *)0x0) {
      uVar1 = buffer->length;
      uVar2 = buffer->offset;
      if (uVar2 < uVar1) {
        do {
          if (0x20 < buffer->content[uVar2]) goto LAB_00103991;
          uVar2 = uVar2 + 1;
          buffer->offset = uVar2;
        } while (uVar1 != uVar2);
      }
      else {
LAB_00103991:
        if (uVar2 != uVar1) {
          return buffer;
        }
      }
      buffer->offset = uVar1 - 1;
      return buffer;
    }
  }
  return (parse_buffer *)0x0;
}

Assistant:

static parse_buffer *buffer_skip_whitespace(parse_buffer * const buffer)
{
    if ((buffer == NULL) || (buffer->content == NULL))
    {
        return NULL;
    }

    while (can_access_at_index(buffer, 0) && (buffer_at_offset(buffer)[0] <= 32))
    {
       buffer->offset++;
    }

    if (buffer->offset == buffer->length)
    {
        buffer->offset--;
    }

    return buffer;
}